

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     compare_types_cast<std::shared_ptr<double>,chaiscript::Boxed_Number_const&,0ul>
               (undefined8 param_1,
               vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *param_2)

{
  bad_boxed_cast *anon_var_0;
  Type_Conversions_State *in_stack_000000a0;
  Boxed_Value *in_stack_000000a8;
  
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_2,0);
  boxed_cast<chaiscript::Boxed_Number_const&>(in_stack_000000a8,in_stack_000000a0);
  Boxed_Number::~Boxed_Number((Boxed_Number *)0x390c0a);
  return true;
}

Assistant:

bool compare_types_cast(Indexes<I...>, Ret (*)(Params...),
             const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          try {
            (void)params; (void)t_conversions;
            (void)std::initializer_list<int>{(boxed_cast<Params>(params[I], &t_conversions), 0)...};
            return true;
          } catch (const exception::bad_boxed_cast &) {
            return false;
          }

        }